

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

int socket_close(Curl_easy *data,connectdata *conn,int use_callback,curl_socket_t sock)

{
  int iVar1;
  
  if (sock == -1) {
    return 0;
  }
  if (conn == (connectdata *)0x0 || use_callback == 0) {
    if (conn == (connectdata *)0x0) goto LAB_0011523d;
  }
  else if (conn->fclosesocket != (curl_closesocket_callback)0x0) {
    Curl_multi_closed(data,sock);
    Curl_set_in_callback(data,true);
    iVar1 = (*conn->fclosesocket)(conn->closesocket_client,sock);
    Curl_set_in_callback(data,false);
    return iVar1;
  }
  Curl_multi_closed(data,sock);
LAB_0011523d:
  close(sock);
  return 0;
}

Assistant:

static int socket_close(struct Curl_easy *data, struct connectdata *conn,
                        int use_callback, curl_socket_t sock)
{
  if(CURL_SOCKET_BAD == sock)
    return 0;

  if(use_callback && conn && conn->fclosesocket) {
    int rc;
    Curl_multi_closed(data, sock);
    Curl_set_in_callback(data, TRUE);
    rc = conn->fclosesocket(conn->closesocket_client, sock);
    Curl_set_in_callback(data, FALSE);
    return rc;
  }

  if(conn)
    /* tell the multi-socket code about this */
    Curl_multi_closed(data, sock);

  sclose(sock);

  return 0;
}